

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [14],Newline *u)

{
  string_view local_30;
  Newline *local_20;
  Newline *u_local;
  char (*t_local) [14];
  CWriter *this_local;
  
  local_20 = u;
  u_local = (Newline *)t;
  t_local = (char (*) [14])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_30);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }